

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::ClassEscapePass1
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,MatchCharNode *deferredCharNode,
          MatchSetNode *deferredSetNode,bool *previousSurrogatePart)

{
  EncodedChar **p;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  undefined4 *puVar7;
  byte *pbVar8;
  int iVar9;
  CharCount n;
  uint uVar10;
  byte *pbVar11;
  uint uVar12;
  ulong uVar13;
  Char local_32 [4];
  Char c;
  
  pbVar8 = this->inputLim;
  pbVar11 = this->next;
  if (pbVar8 <= pbVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xa06,"(!IsEOF())","!IsEOF()");
    if (!bVar2) goto LAB_00ecdf14;
    *puVar7 = 0;
    pbVar8 = this->inputLim;
    pbVar11 = this->next;
  }
  p = &this->next;
  if (pbVar8 < pbVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) goto LAB_00ecdf14;
    *puVar7 = 0;
    pbVar11 = *p;
  }
  uVar13 = (ulong)*pbVar11;
  if ((ASCIIChars::classes[uVar13] & 0x20) != 0) {
    iVar9 = 3;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar10 = 0;
    do {
      if (this->inputLim < pbVar11) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00ecdf14;
        *puVar7 = 0;
        pbVar11 = *p;
        uVar13 = (ulong)*pbVar11;
      }
      bVar5 = (byte)uVar13;
      uVar12 = (uint)(byte)ASCIIChars::values[uVar13] + uVar10 * 8;
      if (0xff < uVar12) break;
      if (this->inputLim < pbVar11 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00ecdf14;
        *puVar7 = 0;
        pbVar11 = *p;
        bVar5 = *pbVar11;
      }
      if ((char)bVar5 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar2) goto LAB_00ecdf14;
        *puVar7 = 0;
        pbVar11 = *p;
      }
      pbVar11 = pbVar11 + 1;
      *p = pbVar11;
      iVar9 = iVar9 + -1;
      uVar10 = uVar12;
      if (iVar9 == 0) break;
      if (this->inputLim < pbVar11) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00ecdf14;
        *puVar7 = 0;
        pbVar11 = *p;
      }
      uVar13 = (ulong)*pbVar11;
    } while ((ASCIIChars::classes[uVar13] & 0x20) != 0);
    deferredCharNode->cs[0] = (Char)uVar10;
    return &deferredCharNode->super_Node;
  }
  pbVar8 = this->inputLim;
  if (pbVar8 <= pbVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x25d,"(!IsEOF())","!IsEOF()");
    if (!bVar2) goto LAB_00ecdf14;
    *puVar7 = 0;
    pbVar8 = this->inputLim;
  }
  local_32[0] = UTF8EncodingPolicyBase<false>::ReadFull<true>
                          (&this->super_UTF8EncodingPolicyBase<false>,p,pbVar8);
  if ((ushort)local_32[0] < 0x62) {
    if (local_32[0] == L'D') {
      StandardChars<char16_t>::SetNonDigits
                (this->standardChars,this->ctAllocator,&deferredSetNode->set);
      return &deferredSetNode->super_Node;
    }
    if (local_32[0] == L'S') {
      StandardChars<char16_t>::SetNonWhitespace
                (this->standardChars,this->ctAllocator,&deferredSetNode->set);
      return &deferredSetNode->super_Node;
    }
    if (local_32[0] == L'W') {
      StandardChars<char16_t>::SetNonWordChars
                (this->standardChars,this->ctAllocator,&deferredSetNode->set);
      return &deferredSetNode->super_Node;
    }
    goto switchD_00ecd957_caseD_65;
  }
  switch(local_32[0]) {
  case L'b':
    local_32[0] = L'\b';
    break;
  case L'c':
    pbVar8 = this->next;
    if (this->inputLim < pbVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) {
LAB_00ecdf14:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
      pbVar8 = *p;
    }
    if ((ASCIIChars::classes[*pbVar8] & 1) == 0) {
      ECRevert(this,1);
      deferredCharNode->cs[0] = L'\\';
      return &deferredCharNode->super_Node;
    }
    bVar5 = ECLookahead(this,0);
    local_32[0] = Chars<char16_t>::UTC((uint)(bVar5 & 0x1f));
    n = 1;
    goto LAB_00ecdef4;
  case L'd':
    StandardChars<char16_t>::SetDigits(this->standardChars,this->ctAllocator,&deferredSetNode->set);
    return &deferredSetNode->super_Node;
  case L'f':
    local_32[0] = L'\f';
    break;
  case L'n':
    local_32[0] = L'\n';
    break;
  case L'r':
    local_32[0] = L'\r';
    break;
  case L's':
    StandardChars<char16_t>::SetWhitespace
              (this->standardChars,this->ctAllocator,&deferredSetNode->set);
    return &deferredSetNode->super_Node;
  case L't':
    local_32[0] = L'\t';
    break;
  case L'u':
    if (((((this->unicodeFlagPresent == true) &&
          (iVar9 = TryParseExtendedUnicodeEscape(this,local_32,previousSurrogatePart,false),
          0 < iVar9)) ||
         ((this->inputLim < this->next + 4 ||
          ((bVar5 = ECLookahead(this,0), (ASCIIChars::classes[bVar5] & 0x40) == 0 ||
           (bVar5 = ECLookahead(this,1), (ASCIIChars::classes[bVar5] & 0x40) == 0)))))) ||
        (bVar5 = ECLookahead(this,2), (ASCIIChars::classes[bVar5] & 0x40) == 0)) ||
       (bVar5 = ECLookahead(this,3), (ASCIIChars::classes[bVar5] & 0x40) == 0)) break;
    bVar5 = ECLookahead(this,0);
    bVar5 = ASCIIChars::values[bVar5];
    bVar6 = ECLookahead(this,1);
    bVar6 = ASCIIChars::values[bVar6];
    bVar3 = ECLookahead(this,2);
    bVar3 = ASCIIChars::values[bVar3];
    bVar4 = ECLookahead(this,3);
    local_32[0] = Chars<char16_t>::UTC
                            ((uint)(byte)ASCIIChars::values[bVar4] | (uint)bVar3 << 4 |
                             (uint)bVar6 << 8 | (uint)bVar5 << 0xc);
    n = 4;
    goto LAB_00ecdef4;
  case L'v':
    local_32[0] = L'\v';
    break;
  case L'w':
    StandardChars<char16_t>::SetWordChars
              (this->standardChars,this->ctAllocator,&deferredSetNode->set);
    return &deferredSetNode->super_Node;
  case L'x':
    if (((this->inputLim < this->next + 2) ||
        (bVar5 = ECLookahead(this,0), (ASCIIChars::classes[bVar5] & 0x40) == 0)) ||
       (bVar5 = ECLookahead(this,1), (ASCIIChars::classes[bVar5] & 0x40) == 0)) break;
    bVar5 = ECLookahead(this,0);
    bVar5 = ASCIIChars::values[bVar5];
    bVar6 = ECLookahead(this,1);
    local_32[0] = Chars<char16_t>::UTC((uint)(byte)ASCIIChars::values[bVar6] | (uint)bVar5 << 4);
    n = 2;
LAB_00ecdef4:
    ECConsume(this,n);
  }
switchD_00ecd957_caseD_65:
  deferredCharNode->cs[0] = local_32[0];
  return &deferredCharNode->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::ClassEscapePass1(MatchCharNode* deferredCharNode, MatchSetNode* deferredSetNode, bool& previousSurrogatePart)
    {
        // Checked for terminating 0 is pass 0
        Assert(!IsEOF());
        if (standardEncodedChars->IsOctal(ECLookahead()))
        {
            // As per Annex B, allow octal escapes instead of just \0 (and \8 and \9 are identity escapes).
            // Must be between 1 and 3 octal digits.
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) //Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not octal
            deferredCharNode->cs[0] = UTC((UChar)n);
            return deferredCharNode;
        }
        else
        {
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                c = '\b';
                break; // fall-through for identity escape
            case 'f':
                c = '\f';
                break; // fall-through for identity escape
            case 'n':
                c = '\n';
                break; // fall-through for identity escape
            case 'r':
                c = '\r';
                break; // fall-through for identity escape
            case 't':
                c = '\t';
                break; // fall-through for identity escape
            case 'v':
                c = '\v';
                break; // fall-through for identity escape
            case 'd':
                standardChars->SetDigits(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'D':
                standardChars->SetNonDigits(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 's':
                standardChars->SetWhitespace(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'S':
                standardChars->SetNonWhitespace(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'w':
                standardChars->SetWordChars(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'W':
                standardChars->SetNonWordChars(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'c':
                if (standardEncodedChars->IsWord(ECLookahead())) // terminating 0 is not a word character
                {
                    c = UTC(Chars<EncodedChar>::CTU(ECLookahead()) % 32);
                    ECConsume();
                    // fall-through for identity escape
                }
                else
                {
                    // If the lookahead is a non-alphanumeric and not an underscore ('_'), then treat '\' and 'c' separately.
                    //#sec-regular-expression-patterns-semantics 
                    ECRevert(1); //Put cursor back at 'c' and treat it as a non-escaped character.
                    deferredCharNode->cs[0] = '\\';
                    return deferredCharNode;
                }
                break;
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case 'u':
                if (unicodeFlagPresent && TryParseExtendedUnicodeEscape(c, previousSurrogatePart) > 0)
                    break;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    ECConsume(4);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B.
                break;
            default:
                // As per Annex B, allow anything other than newlines and above. Embedded 0 is ok.
                break;
            }

            // Must be an identity escape
            deferredCharNode->cs[0] = c;
            return deferredCharNode;
        }
    }